

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void dataDeviceHandleEnter
               (void *userData,wl_data_device *device,uint32_t serial,wl_surface *surface,
               wl_fixed_t x,wl_fixed_t y,wl_data_offer *offer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  wl_data_offer *pwVar3;
  PFN_wl_proxy_marshal_flags UNRECOVERED_JUMPTABLE;
  uint32_t uVar4;
  _GLFWwindow *p_Var5;
  char **ppcVar6;
  long lVar7;
  
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar3 = _glfw.wl.dragOffer;
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    uVar4 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.dragOffer);
    (*UNRECOVERED_JUMPTABLE)((wl_proxy *)pwVar3,2,(wl_interface *)0x0,uVar4,1);
    _glfw.wl.dragOffer = (wl_data_offer *)0x0;
    _glfw.wl.dragFocus = (_GLFWwindow *)0x0;
  }
  if ((ulong)_glfw.wl.offerCount != 0) {
    lVar7 = 0;
    do {
      if (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar7) == offer) {
        (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
        p_Var5 = (_GLFWwindow *)(*_glfw.wl.client.proxy_get_user_data)((wl_proxy *)surface);
        if (((p_Var5->wl).surface == surface) &&
           (*(int *)((long)&(_glfw.wl.offers)->text_uri_list + lVar7) != 0)) {
          _glfw.wl.dragOffer = offer;
          _glfw.wl.dragFocus = p_Var5;
          _glfw.wl.dragSerial = serial;
        }
        uVar2 = *(undefined8 *)&_glfw.wl.offers[_glfw.wl.offerCount - 1].text_plain_utf8;
        puVar1 = (undefined8 *)((long)&(_glfw.wl.offers)->offer + lVar7);
        *puVar1 = _glfw.wl.offers[_glfw.wl.offerCount - 1].offer;
        puVar1[1] = uVar2;
        _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
        break;
      }
      lVar7 = lVar7 + 0x10;
    } while ((ulong)_glfw.wl.offerCount << 4 != lVar7);
  }
  ppcVar6 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
  UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
  pwVar3 = _glfw.wl.dragOffer;
  if (ppcVar6 == &_glfw.wl.tag) {
    uVar4 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)offer);
    if (pwVar3 == (wl_data_offer *)0x0) {
      (*UNRECOVERED_JUMPTABLE)((wl_proxy *)offer,0,(wl_interface *)0x0,uVar4,0,(ulong)serial,0);
      UNRECOVERED_JUMPTABLE = _glfw.wl.client.proxy_marshal_flags;
      uVar4 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)offer);
      (*UNRECOVERED_JUMPTABLE)
                ((wl_proxy *)offer,2,(wl_interface *)0x0,uVar4,1,UNRECOVERED_JUMPTABLE);
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              ((wl_proxy *)offer,0,(wl_interface *)0x0,uVar4,0,(ulong)serial,"text/uri-list");
  }
  return;
}

Assistant:

static void dataDeviceHandleEnter(void* userData,
                                  struct wl_data_device* device,
                                  uint32_t serial,
                                  struct wl_surface* surface,
                                  wl_fixed_t x,
                                  wl_fixed_t y,
                                  struct wl_data_offer* offer)
{
    if (_glfw.wl.dragOffer)
    {
        wl_data_offer_destroy(_glfw.wl.dragOffer);
        _glfw.wl.dragOffer = NULL;
        _glfw.wl.dragFocus = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            _GLFWwindow* window = NULL;

            if (surface)
            {
                if (wl_proxy_get_tag((struct wl_proxy*) surface) == &_glfw.wl.tag)
                    window = wl_surface_get_user_data(surface);
            }

            if (surface == window->wl.surface && _glfw.wl.offers[i].text_uri_list)
            {
                _glfw.wl.dragOffer = offer;
                _glfw.wl.dragFocus = window;
                _glfw.wl.dragSerial = serial;
            }

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    if (_glfw.wl.dragOffer)
        wl_data_offer_accept(offer, serial, "text/uri-list");
    else
    {
        wl_data_offer_accept(offer, serial, NULL);
        wl_data_offer_destroy(offer);
    }
}